

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

__ssize_t Bstrlib::getline(char **__lineptr,size_t *__n,FILE *__stream)

{
  sgetc parm;
  char terminator_local;
  CBString *b_local;
  istream *sin_local;
  
  CBString::gets((CBString *)__n,(char *)istreamGetc);
  if ((0 < *(int *)((long)__n + 0xc)) &&
     ((uint)*(byte *)(__n[2] + (long)(*(int *)((long)__n + 0xc) + -1)) == (int)(char)__stream)) {
    *(int *)((long)__n + 0xc) = *(int *)((long)__n + 0xc) + -1;
  }
  return (__ssize_t)__lineptr;
}

Assistant:

std::istream& getline (std::istream& sin, CBString& b, char terminator) {
struct sgetc parm;
	parm.sin = &sin;
	parm.terminator = terminator;
	b.gets ((bNgetc) istreamGetc, &parm, terminator);
	if (b.slen > 0 && b.data[b.slen-1] == terminator) b.slen--;
 	return sin;
}